

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

Abc_Obj_t * Abc_NtkFindCo(Abc_Ntk_t *pNtk,char *pName)

{
  uint uVar1;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x234,"Abc_Obj_t *Abc_NtkFindCo(Abc_Ntk_t *, char *)");
  }
  uVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,3);
  if (((int)uVar1 < 0) && (uVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,4), (int)uVar1 < 0)) {
    return (Abc_Obj_t *)0x0;
  }
  if ((int)uVar1 < pNtk->vObjs->nSize) {
    return (Abc_Obj_t *)pNtk->vObjs->pArray[uVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkFindCo( Abc_Ntk_t * pNtk, char * pName )
{
    int Num;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_PO );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BI );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    return NULL;
}